

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::ReadIntoBuffer(BamStandardIndex *this,uint *bytesRequested)

{
  IBamIODevice *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  BamException *this_00;
  stringstream s;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  CheckBufferSize(&(this->m_resources).Buffer,&this->m_bufferLength,bytesRequested);
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,(this->m_resources).Buffer,(ulong)*bytesRequested)
  ;
  if (CONCAT44(extraout_var,iVar2) == (ulong)*bytesRequested) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"expected to read: ",0x12);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," bytes, ",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"but instead read: ",0x12);
  std::ostream::_M_insert<long>((long)poVar3);
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,"BamStandardIndex::ReadIntoBuffer","");
  std::__cxx11::stringbuf::str();
  BamException::BamException(this_00,&local_1e8,&local_1c8);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::ReadIntoBuffer(const unsigned int& bytesRequested)
{

    // ensure that our buffer is big enough for request
    BamStandardIndex::CheckBufferSize(m_resources.Buffer, m_bufferLength, bytesRequested);

    // read from BAI file stream
    const int64_t bytesRead = m_resources.Device->Read(m_resources.Buffer, bytesRequested);
    if (bytesRead != static_cast<int64_t>(bytesRequested)) {
        std::stringstream s;
        s << "expected to read: " << bytesRequested << " bytes, "
          << "but instead read: " << bytesRead;
        throw BamException("BamStandardIndex::ReadIntoBuffer", s.str());
    }
}